

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O1

APInt __thiscall llvm::APInt::ssub_ov(APInt *this,APInt *RHS,bool *Overflow)

{
  bool bVar1;
  bool bVar2;
  undefined8 in_RCX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  ulong __n;
  APInt AVar4;
  anon_union_8_2_1313ab2f_for_U local_40;
  uint local_38;
  
  local_38 = RHS->BitWidth;
  if ((ulong)local_38 < 0x41) {
    local_40 = RHS->U;
  }
  else {
    __n = (ulong)((uint)((ulong)local_38 + 0x3f >> 3) & 0xfffffff8);
    local_40.pVal = (uint64_t *)operator_new__(__n);
    memcpy(local_40.pVal,(RHS->U).pVal,__n);
  }
  operator-=((APInt *)&local_40,(APInt *)Overflow);
  this->BitWidth = local_38;
  this->U = local_40;
  local_38 = 0;
  bVar1 = operator[](RHS,RHS->BitWidth - 1);
  bVar2 = operator[]((APInt *)Overflow,*(int *)(Overflow + 8) - 1);
  if (bVar1 == bVar2) {
    bVar1 = false;
    uVar3 = extraout_RDX;
  }
  else {
    bVar1 = operator[](this,this->BitWidth - 1);
    bVar2 = operator[](RHS,RHS->BitWidth - 1);
    bVar1 = bVar2 != bVar1;
    uVar3 = extraout_RDX_00;
  }
  *(bool *)in_RCX = bVar1;
  AVar4._8_8_ = uVar3;
  AVar4.U.pVal = (uint64_t *)this;
  return AVar4;
}

Assistant:

APInt APInt::ssub_ov(const APInt &RHS, bool &Overflow) const {
  APInt Res = *this - RHS;
  Overflow = isNonNegative() != RHS.isNonNegative() &&
             Res.isNonNegative() != isNonNegative();
  return Res;
}